

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

void stbi__hdr_convert(float *output,stbi_uc *input,int req_comp)

{
  float fVar1;
  double dVar2;
  float f1;
  int req_comp_local;
  stbi_uc *input_local;
  float *output_local;
  
  if (input[3] == '\0') {
    switch(req_comp) {
    case 2:
      output[1] = 1.0;
    case 1:
      *output = 0.0;
      break;
    case 4:
      output[3] = 1.0;
    case 3:
      output[2] = 0.0;
      output[1] = 0.0;
      *output = 0.0;
    }
  }
  else {
    dVar2 = ldexp(1.0,input[3] - 0x88);
    fVar1 = (float)dVar2;
    if (req_comp < 3) {
      *output = ((float)((uint)*input + (uint)input[1] + (uint)input[2]) * fVar1) / 3.0;
    }
    else {
      *output = (float)*input * fVar1;
      output[1] = (float)input[1] * fVar1;
      output[2] = (float)input[2] * fVar1;
    }
    if (req_comp == 2) {
      output[1] = 1.0;
    }
    if (req_comp == 4) {
      output[3] = 1.0;
    }
  }
  return;
}

Assistant:

static void stbi__hdr_convert(float *output, stbi_uc *input, int req_comp)
{
   if ( input[3] != 0 ) {
      float f1;
      // Exponent
      f1 = (float) ldexp(1.0f, input[3] - (int)(128 + 8));
      if (req_comp <= 2)
         output[0] = (input[0] + input[1] + input[2]) * f1 / 3;
      else {
         output[0] = input[0] * f1;
         output[1] = input[1] * f1;
         output[2] = input[2] * f1;
      }
      if (req_comp == 2) output[1] = 1;
      if (req_comp == 4) output[3] = 1;
   } else {
      switch (req_comp) {
         case 4: output[3] = 1; /* fallthrough */
         case 3: output[0] = output[1] = output[2] = 0;
                 break;
         case 2: output[1] = 1; /* fallthrough */
         case 1: output[0] = 0;
                 break;
      }
   }
}